

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall mp::SPAdapter::ProcessCons(SPAdapter *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ColProblem *pCVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pRVar8;
  pointer pBVar9;
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar10;
  int iVar11;
  ulong uVar12;
  pointer pRVar13;
  pointer piVar14;
  int iVar15;
  long lVar16;
  vector<int,_std::allocator<int>_> *this_01;
  long lVar17;
  uint uVar18;
  int iVar19;
  vector<int,_std::allocator<int>_> stage_offsets;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar18 = (int)((long)(this->problem_->super_Problem).algebraic_cons_.
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->problem_->super_Problem).algebraic_cons_.
                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f;
  local_68 = &this->num_stage_cons_;
  std::vector<int,_std::allocator<int>_>::resize(local_68,(long)this->num_stages_);
  if (uVar18 != 0) {
    local_60 = &this->con_orig2core_;
    local_50 = (size_type)(int)uVar18;
    std::vector<int,_std::allocator<int>_>::resize(local_60,local_50);
    this_00 = local_68;
    puVar10 = (uint *)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    iVar11 = this->num_stages_;
    if (1 < iVar11) {
      uVar12 = (ulong)*puVar10;
      pCVar4 = this->problem_;
      piVar14 = (this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = 1;
      do {
        uVar1 = puVar10[lVar16];
        if (0 < (int)uVar1) {
          iVar11 = (int)uVar12;
          piVar5 = (pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = (ulong)iVar11;
          do {
            lVar17 = (long)piVar14[uVar12];
            iVar2 = piVar5[lVar17];
            iVar3 = piVar5[lVar17 + 1];
            if (iVar3 != iVar2) {
              piVar7 = (pCVar4->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar17 = 0;
              do {
                iVar15 = piVar7[iVar2 + lVar17];
                iVar19 = piVar6[iVar15];
                if (iVar19 <= (int)lVar16) {
                  iVar19 = (int)lVar16;
                }
                piVar6[iVar15] = iVar19;
                lVar17 = lVar17 + 1;
              } while (iVar3 - iVar2 != (int)lVar17);
            }
            uVar12 = uVar12 + 1;
          } while ((long)uVar12 < (long)(int)(uVar1 + iVar11));
          iVar11 = this->num_stages_;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar11);
    }
    pRVar13 = (this->random_vars_).
              super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar8 = (this->random_vars_).
             super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar13 != pRVar8) {
      pCVar4 = this->problem_;
      piVar14 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (pCVar4->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar11 = piVar5[pRVar13->var_index];
        iVar2 = piVar5[(long)pRVar13->var_index + 1];
        if (iVar2 != iVar11) {
          piVar6 = (pCVar4->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = 0;
          do {
            iVar3 = piVar6[iVar11 + lVar16];
            iVar15 = piVar14[iVar3];
            if (iVar15 < 2) {
              iVar15 = 1;
            }
            piVar14[iVar3] = iVar15;
            lVar16 = lVar16 + 1;
          } while (iVar2 - iVar11 != (int)lVar16);
        }
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != pRVar8);
    }
    this_01 = &this->num_stage_vars_;
    if ((int)uVar18 < 1) {
      piVar14 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      uVar12 = 0;
      local_58 = this_01;
      do {
        piVar5 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar9 = (this->problem_->super_Problem).nonlinear_cons_.
                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar12 < (ulong)((long)(this->problem_->super_Problem).nonlinear_cons_.
                                   super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9 >> 3))
        {
          iVar11 = piVar5[uVar12];
          if (pBVar9[uVar12].super_ExprBase.impl_ != (Impl *)0x0) {
            if (iVar11 < 2) {
              iVar11 = 1;
            }
            piVar5[uVar12] = iVar11;
          }
        }
        else {
          iVar11 = piVar5[uVar12];
        }
        piVar14 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->num_stage_cons_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar14) >> 2) <= iVar11)
        {
          std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(iVar11 + 1));
          iVar11 = piVar5[uVar12];
          piVar14 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        piVar14[iVar11] = piVar14[iVar11] + 1;
        uVar12 = uVar12 + 1;
      } while ((uVar18 & 0x7fffffff) != uVar12);
      puVar10 = (uint *)(local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      this_01 = local_58;
    }
    uVar12 = (long)(this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar14;
    if ((ulong)((long)(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar10) < uVar12) {
      iVar11 = (int)(uVar12 >> 2);
      this->num_stages_ = iVar11;
      std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar11);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->con_core2orig_,local_50);
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)this->num_stages_,&local_69);
    if (1 < this->num_stages_) {
      piVar14 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar11 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = 1;
      do {
        iVar11 = iVar11 + piVar14[lVar16 + -1];
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar16] = iVar11;
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->num_stages_);
    }
    if ((int)uVar18 < 1) {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (int *)0x0) {
        return;
      }
    }
    else {
      piVar14 = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        iVar11 = piVar14[uVar12];
        iVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11];
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar11] = iVar2 + 1;
        piVar5[iVar2] = (int)uVar12;
        piVar14[uVar12] = iVar2;
        uVar12 = uVar12 + 1;
      } while ((uVar18 & 0x7fffffff) != uVar12);
    }
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPAdapter::ProcessCons() {
  int num_cons = problem_.num_algebraic_cons();
  num_stage_cons_.resize(num_stages_);
  if (num_cons == 0)
    return;
  // Compute stage of each constraint as a maximum of stages of variables
  // in it and temporarily store stages in con_orig2core_.
  con_orig2core_.resize(num_cons);
  int core_var_index = num_stage_vars_[0];
  for (int stage = 1; stage < num_stages_; ++stage) {
    for (int n = core_var_index + num_stage_vars_[stage];
         core_var_index < n; ++core_var_index) {
      UpdateConStages(var_core2orig_[core_var_index], stage);
    }
  }
  // Constraints containing random variables should be at least in the
  // second stage.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i)
    UpdateConStages(i->var_index, 1);
  for (int i = 0; i < num_cons; ++i) {
    int &stage = con_orig2core_[i];
    if (problem_.algebraic_con(i).nonlinear_expr())
      stage = std::max(con_orig2core_[i], 1);
    if (stage >= static_cast<int>(num_stage_cons_.size()))
      num_stage_cons_.resize(stage + 1);
    ++num_stage_cons_[stage];
  }
  if (num_stage_cons_.size() > num_stage_vars_.size()) {
    num_stages_ = (int)num_stage_cons_.size();
    num_stage_vars_.resize(num_stages_);
  }
  // Reorder constraints by stages.
  con_core2orig_.resize(num_cons);
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_cons_[i - 1];
  for (int i = 0; i < num_cons; ++i) {
    int stage = con_orig2core_[i];
    int core_con_index = stage_offsets[stage]++;
    con_core2orig_[core_con_index] = i;
    con_orig2core_[i] = core_con_index++;
  }
}